

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

char * CaptureDecimalInteger(char *szDataPtr,char *szDataEnd,PDWORD PtrValue)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  
  for (; (szDataPtr < szDataEnd && (*szDataPtr == 0x20));
      szDataPtr = (char *)((byte *)szDataPtr + 1)) {
  }
  uVar3 = 0;
  for (; szDataPtr < szDataEnd; szDataPtr = (char *)((byte *)szDataPtr + 1)) {
    bVar1 = *szDataPtr;
    if (bVar1 == 0x20) break;
    if ((9 < (byte)(bVar1 - 0x30)) || (uVar2 = bVar1 - 0x30, CARRY4(uVar3,uVar2))) {
      return (char *)0x0;
    }
    uVar3 = uVar2 + uVar3 * 10;
  }
  *PtrValue = uVar3;
  return szDataPtr;
}

Assistant:

static const char * CaptureDecimalInteger(const char * szDataPtr, const char * szDataEnd, PDWORD PtrValue)
{
    DWORD TotalValue = 0;
    DWORD AddValue = 0;

    // Skip all spaces
    while (szDataPtr < szDataEnd && szDataPtr[0] == ' ')
        szDataPtr++;

    // Load the number
    while (szDataPtr < szDataEnd && szDataPtr[0] != ' ')
    {
        // Must only contain decimal digits ('0' - '9')
        if (!IsCharDigit(szDataPtr[0]))
            return NULL;

        // Get the next value and verify overflow
        AddValue = szDataPtr[0] - '0';
        if ((TotalValue + AddValue) < TotalValue)
            return NULL;

        TotalValue = (TotalValue * 10) + AddValue;
        szDataPtr++;
    }

    // Give the result
    PtrValue[0] = TotalValue;
    return szDataPtr;
}